

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O2

char parity_to_text(parity p)

{
  if (p.value_ < (even|odd)) {
    return (char)(0x454f4e >> ((byte)(p.value_ << 3) & 0x1f));
  }
  __assert_fail("!\"can\'t be\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface.cpp"
                ,0x51,"char parity_to_text(boost::asio::serial_port_base::parity)");
}

Assistant:

char parity_to_text( boost::asio::serial_port_base::parity p )
{
    using type = boost::asio::serial_port_base::parity::type;

    switch ( p.value() )
    {
        case type::none:
            return 'N';
        case type::odd:
            return 'O';
        case type::even:
            return 'E';
    }

    assert( !"can't be" );
}